

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O2

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_Gudhi::persistent_cohomology::Field_Zp>
::output_diagram(Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_Gudhi::persistent_cohomology::Field_Zp>
                 *this,ostream *ostream)

{
  pointer ptVar1;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *ppVar2;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *ppVar3;
  int iVar4;
  ostream *poVar5;
  Filtration_value *pFVar6;
  pointer ptVar7;
  Simplex_handle local_38;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>*,std::vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,Gudhi::persistent_cohomology::Field_Zp>::cmp_intervals_by_length>>
            ((this->persistent_pairs_).
             super__Vector_base<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>,_std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->persistent_pairs_).
             super__Vector_base<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>,_std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_Gudhi::persistent_cohomology::Field_Zp>::cmp_intervals_by_length>
              )this->cpx_);
  ptVar1 = (this->persistent_pairs_).
           super__Vector_base<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>,_std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar7 = (this->persistent_pairs_).
                super__Vector_base<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>,_std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar7 != ptVar1; ptVar7 = ptVar7 + 1) {
    ppVar2 = (ptVar7->
             super__Tuple_impl<0UL,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>
             ).
             super__Tuple_impl<1UL,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>
             .
             super__Head_base<1UL,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_false>
             ._M_head_impl.m_ptr;
    ppVar3 = (ptVar7->
             super__Tuple_impl<0UL,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>
             ).
             super__Head_base<0UL,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_false>
             ._M_head_impl.m_ptr;
    poVar5 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)ostream,
                        (ptVar7->
                        super__Tuple_impl<0UL,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>
                        ).
                        super__Tuple_impl<1UL,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>
                        .super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl)
    ;
    poVar5 = std::operator<<(poVar5,"  ");
    local_38.m_ptr = ppVar3;
    iVar4 = Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(this->cpx_,&local_38);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar4);
    std::operator<<(poVar5," ");
    pFVar6 = (Filtration_value *)&ppVar3->second;
    if (ppVar3 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                   *)0x0) {
      pFVar6 = &Simplex_tree<Gudhi::Simplex_tree_options_default>::Filtration_simplex_base_real::
                inf_;
    }
    poVar5 = std::ostream::_M_insert<double>
                       ((((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
                           *)pFVar6)->super_Filtration_simplex_base).filt_);
    std::operator<<(poVar5," ");
    pFVar6 = (Filtration_value *)&ppVar2->second;
    if (ppVar2 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                   *)0x0) {
      pFVar6 = &Simplex_tree<Gudhi::Simplex_tree_options_default>::Filtration_simplex_base_real::
                inf_;
    }
    poVar5 = std::ostream::_M_insert<double>
                       ((((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
                           *)pFVar6)->super_Filtration_simplex_base).filt_);
    poVar5 = std::operator<<(poVar5," ");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  return;
}

Assistant:

void output_diagram(std::ostream& ostream = std::cout) {
    cmp_intervals_by_length cmp(cpx_);
    std::sort(std::begin(persistent_pairs_), std::end(persistent_pairs_), cmp);
    for (auto pair : persistent_pairs_) {
      ostream << get<2>(pair) << "  " << cpx_->dimension(get<0>(pair)) << " "
        << cpx_->filtration(get<0>(pair)) << " "
        << cpx_->filtration(get<1>(pair)) << " " << std::endl;
    }
  }